

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

bool __thiscall
EnvironmentNAVXYTHETALATTICE::InitializeEnv
          (EnvironmentNAVXYTHETALATTICE *this,char *sEnvFile,
          vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *perimeterptsV,char *sMotPrimFile)

{
  int iVar1;
  FILE *pFVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  SBPL_Exception *pSVar5;
  string local_1d0;
  stringstream ss;
  ostream local_1a0 [376];
  
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::operator=
            (&(this->EnvNAVXYTHETALATCfg).FootprintPolygon,perimeterptsV);
  fflush(_stdout);
  pFVar2 = fopen(sEnvFile,"r");
  if (pFVar2 == (FILE *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar3 = std::operator<<(local_1a0,"ERROR: unable to open ");
    std::operator<<(poVar3,sEnvFile);
    pSVar5 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    SBPL_Exception::SBPL_Exception(pSVar5,&local_1d0);
    __cxa_throw(pSVar5,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x37])(this,pFVar2);
  fclose(pFVar2);
  if (sMotPrimFile == (char *)0x0) {
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x3b])(this,0);
    return true;
  }
  pFVar2 = fopen(sMotPrimFile,"r");
  if (pFVar2 == (FILE *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar3 = std::operator<<(local_1a0,"ERROR: unable to open ");
    std::operator<<(poVar3,sMotPrimFile);
    pSVar5 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    SBPL_Exception::SBPL_Exception(pSVar5,&local_1d0);
    __cxa_throw(pSVar5,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x4d])
                    (this,pFVar2);
  if ((char)iVar1 != '\0') {
    iVar1 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x21])
                      ((this->EnvNAVXYTHETALATCfg).StartTheta_rad,this);
    (this->EnvNAVXYTHETALATCfg).StartTheta = iVar1;
    if ((iVar1 < 0) || ((this->EnvNAVXYTHETALATCfg).NumThetaDirs <= iVar1)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      pSVar5 = (SBPL_Exception *)operator_new(0x10);
      SBPL_Exception::SBPL_Exception(pSVar5,"ERROR: illegal start coordinates for theta");
    }
    else {
      iVar1 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x21])
                        ((this->EnvNAVXYTHETALATCfg).EndTheta_rad,this);
      (this->EnvNAVXYTHETALATCfg).EndTheta = iVar1;
      if ((-1 < iVar1) && (iVar1 < (this->EnvNAVXYTHETALATCfg).NumThetaDirs)) {
        (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x3b])
                  (this,&(this->EnvNAVXYTHETALATCfg).mprimV);
        fclose(pFVar2);
        return true;
      }
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      pSVar5 = (SBPL_Exception *)operator_new(0x10);
      SBPL_Exception::SBPL_Exception(pSVar5,"ERROR: illegal goal coordinates for theta");
    }
    *puVar4 = pSVar5;
    __cxa_throw(puVar4,&SBPL_Exception*::typeinfo,0);
  }
  pSVar5 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
  SBPL_Exception::SBPL_Exception(pSVar5,"ERROR: failed to read in motion primitive file");
  __cxa_throw(pSVar5,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool EnvironmentNAVXYTHETALATTICE::InitializeEnv(
    const char* sEnvFile,
    const std::vector<sbpl_2Dpt_t>& perimeterptsV,
    const char* sMotPrimFile)
{
    EnvNAVXYTHETALATCfg.FootprintPolygon = perimeterptsV;

    SBPL_INFO("InitializeEnv start: sEnvFile=%s sMotPrimFile=%s\n", sEnvFile, sMotPrimFile);
    fflush(stdout);

    FILE* fCfg = fopen(sEnvFile, "r");
    if (fCfg == NULL) {
        std::stringstream ss;
        ss << "ERROR: unable to open " << sEnvFile;
        throw SBPL_Exception(ss.str());
    }

    ReadConfiguration(fCfg);
    fclose(fCfg);

    if (sMotPrimFile != NULL) {
        FILE* fMotPrim = fopen(sMotPrimFile, "r");
        if (fMotPrim == NULL) {
            std::stringstream ss;
            ss << "ERROR: unable to open " << sMotPrimFile;
            throw SBPL_Exception(ss.str());
        }
        if (ReadMotionPrimitives(fMotPrim) == false) {
            throw SBPL_Exception("ERROR: failed to read in motion primitive file");
        }

        EnvNAVXYTHETALATCfg.StartTheta = ContTheta2DiscNew(EnvNAVXYTHETALATCfg.StartTheta_rad);
        if (EnvNAVXYTHETALATCfg.StartTheta < 0 ||
            EnvNAVXYTHETALATCfg.StartTheta >= EnvNAVXYTHETALATCfg.NumThetaDirs)
        {
            throw new SBPL_Exception("ERROR: illegal start coordinates for theta");
        }
        EnvNAVXYTHETALATCfg.EndTheta = ContTheta2DiscNew(EnvNAVXYTHETALATCfg.EndTheta_rad);
        if (EnvNAVXYTHETALATCfg.EndTheta < 0 ||
            EnvNAVXYTHETALATCfg.EndTheta >= EnvNAVXYTHETALATCfg.NumThetaDirs)
        {
            throw new SBPL_Exception("ERROR: illegal goal coordinates for theta");
        }

        InitGeneral(&EnvNAVXYTHETALATCfg.mprimV);
        fclose(fMotPrim);
    }
    else {
        InitGeneral( NULL);
    }

    SBPL_PRINTF("size of env: %d by %d\n", EnvNAVXYTHETALATCfg.EnvWidth_c, EnvNAVXYTHETALATCfg.EnvHeight_c);

    return true;
}